

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::MultiVertexArrayTest::iterate(MultiVertexArrayTest *this)

{
  undefined8 *puVar1;
  GLValue *pGVar2;
  Storage *this_00;
  Primitive PVar3;
  InputType type;
  int iVar4;
  uint uVar5;
  int componentCount;
  int offset;
  int stride;
  TestLog *pTVar6;
  ContextArrayPack *pCVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  GLValue GVar14;
  GLValue GVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  pointer pAVar23;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  pointer pAVar24;
  char *description;
  byte bVar25;
  int arrayNdx;
  long lVar26;
  ulong uVar27;
  qpTestResult testResult;
  int seed;
  TestContext *this_01;
  int iVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  float local_264;
  char *local_250;
  string local_1d8;
  ArraySpec arraySpec;
  
  if (this->m_iteration == 1) {
    VertexArrayTest::compare(&this->super_VertexArrayTest);
    if ((this->super_VertexArrayTest).m_isOk == true) {
      this_01 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      bVar16 = isUnalignedBufferOffsetTest(this);
      if (bVar16) {
        this_01 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
        description = "Failed to draw with unaligned buffers.";
      }
      else {
        bVar16 = isUnalignedBufferStrideTest(this);
        this_01 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
        if (!bVar16) {
          description = "Image comparison failed.";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_00853068;
        }
        description = "Failed to draw with unaligned stride.";
      }
      testResult = QP_TEST_RESULT_COMPATIBILITY_WARNING;
    }
LAB_00853068:
    tcu::TestContext::setTestResult(this_01,testResult,description);
    this->m_iteration = this->m_iteration + 1;
    return STOP;
  }
  if (this->m_iteration != 0) {
    return STOP;
  }
  PVar3 = (this->m_spec).primitive;
  uVar17 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[2])();
  pTVar6 = ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &arraySpec.storage;
  arraySpec.inputType = (InputType)pTVar6;
  arraySpec.outputType = (OutputType)((ulong)pTVar6 >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  Spec::getDesc_abi_cxx11_(&local_1d8,&this->m_spec);
  std::operator<<((ostream *)this_00,(string *)&local_1d8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&arraySpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  pAVar23 = (this->m_spec).arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = pAVar23->inputType;
  uVar10 = pAVar23->outputType;
  uVar11._0_4_ = pAVar23->storage;
  uVar11._4_4_ = pAVar23->usage;
  uVar12._0_4_ = pAVar23->componentCount;
  uVar12._4_4_ = pAVar23->offset;
  arraySpec.stride = pAVar23->stride;
  arraySpec.normalize = pAVar23->normalize;
  arraySpec._29_3_ = *(undefined3 *)&pAVar23->field_0x1d;
  arraySpec.min.type = (pAVar23->min).type;
  arraySpec.min._4_4_ = *(undefined4 *)&(pAVar23->min).field_0x4;
  arraySpec.min.field_1 = (pAVar23->min).field_1;
  arraySpec.max.type = (pAVar23->max).type;
  arraySpec.max._4_4_ = *(undefined4 *)&(pAVar23->max).field_0x4;
  arraySpec.max.field_1 = (pAVar23->max).field_1;
  arraySpec.storage._0_3_ = (undefined3)(undefined4)uVar11;
  arraySpec._11_4_ = SUB84((ulong)uVar11 >> 0x18,0);
  arraySpec.usage._3_1_ = (undefined1)((uint)uVar11._4_4_ >> 0x18);
  arraySpec.componentCount._0_3_ = (undefined3)(undefined4)uVar12;
  arraySpec._19_5_ = SUB85((ulong)uVar12 >> 0x18,0);
  arraySpec.inputType = uVar9;
  arraySpec.outputType = uVar10;
  if (uVar9 == INPUTTYPE_INT_2_10_10_10) {
    if (arraySpec.normalize == false) {
      fVar30 = 0.001953125;
      goto LAB_00852af7;
    }
  }
  else {
    if (uVar9 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
      if ((arraySpec.normalize == false) ||
         ((fVar30 = 1.0, (uint)uVar9 < INPUTTYPE_UNSIGNED_INT_2_10_10_10 &&
          ((0x207U >> (uVar9 & 0x1f) & 1) != 0)))) {
        fVar30 = GLValue::toFloat(&arraySpec.max);
        fVar30 = 0.9 / fVar30;
      }
      goto LAB_00852af7;
    }
    if (arraySpec.normalize == false) {
      fVar30 = 0.0009765625;
      goto LAB_00852af7;
    }
  }
  fVar30 = 1.0;
LAB_00852af7:
  if ((arraySpec.outputType < OUTPUTTYPE_LAST) &&
     ((0xd8cU >> (arraySpec.outputType & 0x1f) & 1) != 0)) {
    fVar30 = fVar30 * 0.5;
  }
  iVar18 = (uint)(PVar3 == PRIMITIVE_TRIANGLES) * 5 + 1;
  lVar26 = 1;
  lVar29 = 0x40;
  local_264 = 1.0;
  while( true ) {
    pAVar23 = (this->m_spec).arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar24 = (this->m_spec).arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)pAVar24 - (long)pAVar23) >> 6) <= lVar26) break;
    puVar1 = (undefined8 *)((long)&pAVar23->inputType + lVar29);
    uVar11 = *puVar1;
    uVar12 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pAVar23->componentCount + lVar29);
    uVar13 = *puVar1;
    arraySpec._24_8_ = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pAVar23->min).type + lVar29);
    arraySpec.min._0_8_ = *puVar1;
    arraySpec.min.field_1 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(puVar1 + 1);
    puVar1 = (undefined8 *)((long)&(pAVar23->max).type + lVar29);
    arraySpec.max._0_8_ = *puVar1;
    arraySpec.max.field_1 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(puVar1 + 1);
    arraySpec.componentCount._0_3_ = (undefined3)uVar13;
    arraySpec._19_5_ = SUB85((ulong)uVar13 >> 0x18,0);
    arraySpec.inputType = (InputType)uVar11;
    arraySpec.outputType = (OutputType)((ulong)uVar11 >> 0x20);
    arraySpec.storage._0_3_ = (undefined3)uVar12;
    arraySpec._11_4_ = SUB84((ulong)uVar12 >> 0x18,0);
    arraySpec.usage._3_1_ = (undefined1)((ulong)uVar12 >> 0x38);
    if ((arraySpec.normalize != true) ||
       ((fVar31 = 1.0, arraySpec.inputType < INPUTTYPE_UNSIGNED_INT_2_10_10_10 &&
        (fVar31 = 1.0, (0x207U >> (arraySpec.inputType & 0x1f) & 1) != 0)))) {
      fVar31 = GLValue::toFloat(&arraySpec.max);
      fVar31 = 1.0 / fVar31;
    }
    local_264 = local_264 * fVar31;
    if (arraySpec.outputType == OUTPUTTYPE_VEC4) {
      if ((arraySpec.normalize != true) ||
         ((fVar31 = 1.0, arraySpec.inputType < INPUTTYPE_UNSIGNED_INT_2_10_10_10 &&
          (fVar31 = 1.0, (0x207U >> (arraySpec.inputType & 0x1f) & 1) != 0)))) {
        fVar31 = GLValue::toFloat(&arraySpec.max);
        fVar31 = 1.0 / fVar31;
      }
      local_264 = local_264 * fVar31;
    }
    lVar26 = lVar26 + 1;
    lVar29 = lVar29 + 0x40;
  }
  lVar26 = 0;
  for (uVar27 = 0; (long)uVar27 < (long)(int)((ulong)((long)pAVar24 - (long)pAVar23) >> 6);
      uVar27 = uVar27 + 1) {
    type = *(InputType *)((long)&pAVar23->inputType + lVar26);
    iVar4 = *(int *)((long)&pAVar23->outputType + lVar26);
    uVar5 = *(uint *)((long)&pAVar23->storage + lVar26);
    iVar22 = *(int *)((long)&pAVar23->usage + lVar26);
    componentCount = *(int *)((long)&pAVar23->componentCount + lVar26);
    offset = *(int *)((long)&pAVar23->offset + lVar26);
    stride = *(int *)((long)&pAVar23->stride + lVar26);
    bVar16 = (&pAVar23->normalize)[lVar26];
    uVar11 = *(undefined8 *)(&pAVar23->field_0x1d + lVar26);
    uVar12 = *(undefined8 *)((long)(&pAVar23->field_0x1d + lVar26) + 8);
    arraySpec.inputType = (InputType)uVar11;
    arraySpec.outputType = (OutputType)((ulong)uVar11 >> 0x20);
    arraySpec.storage._0_3_ = (undefined3)uVar12;
    arraySpec._11_4_ = SUB84((ulong)uVar12 >> 0x18,0);
    arraySpec.componentCount._0_3_ =
         (undefined3)((uint)*(undefined4 *)((long)&(pAVar23->min).field_1 + lVar26 + 4) >> 8);
    arraySpec.usage._3_1_ = (undefined1)((ulong)uVar12 >> 0x38);
    pGVar2 = (GLValue *)((long)&(pAVar23->max).type + lVar26);
    GVar14 = *pGVar2;
    GVar15 = *pGVar2;
    PVar3 = (this->m_spec).primitive;
    iVar21 = (this->m_spec).drawCount;
    iVar28 = Array::inputTypeSize::size[(int)type];
    iVar8 = stride;
    if (stride == 0) {
      iVar8 = iVar28 * componentCount;
    }
    iVar19 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
    iVar19 = *(int *)CONCAT44(extraout_var,iVar19);
    iVar20 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
    iVar20 = *(int *)(CONCAT44(extraout_var_00,iVar20) + 4);
    if (iVar19 < iVar20) {
      iVar20 = iVar19;
    }
    if ((this->m_spec).primitive == PRIMITIVE_TRIANGLES) {
      seed = PVar3 * 1000 + iVar21 +
             componentCount * 0xc + stride + (bVar16 & 1) +
             iVar22 * 10000 + uVar5 * 100 + iVar4 * 10 + type;
      iVar19 = (this->m_spec).drawCount;
      if (lVar26 == 0) {
        GVar15.field_1._4_4_ = arraySpec._15_4_;
        GVar15.field_1.fl.m_value = (Float)(Float)arraySpec._11_4_;
        GVar15._4_4_ = (int)(CONCAT35((undefined3)arraySpec.storage,
                                      CONCAT41(arraySpec.outputType,arraySpec.inputType._3_1_)) >>
                            0x20);
        GVar15.type = (int)CONCAT41(arraySpec.outputType,arraySpec.inputType._3_1_);
        local_250 = RandomArrayGenerator::generateQuads
                              (seed,iVar19,componentCount,offset,stride,PRIMITIVE_TRIANGLES,type,
                               GVar15,GVar14,3.0 / (float)(iVar20 + -1));
      }
      else {
        GVar14._4_4_ = (int)(CONCAT35((undefined3)arraySpec.storage,
                                      CONCAT41(arraySpec.outputType,arraySpec.inputType._3_1_)) >>
                            0x20);
        GVar14.type = (int)CONCAT41(arraySpec.outputType,arraySpec.inputType._3_1_);
        GVar14.field_1.fl.m_value = (Float)(Float)arraySpec._11_4_;
        GVar14.field_1._4_4_ = arraySpec._15_4_;
        local_250 = RandomArrayGenerator::generatePerQuad
                              (seed,iVar19,componentCount,stride,PRIMITIVE_TRIANGLES,type,GVar14,
                               GVar15);
      }
    }
    else {
      local_250 = (char *)0x0;
    }
    iVar28 = iVar28 * componentCount + offset + iVar8 * (iVar21 * iVar18 + -1);
    pCVar7 = (this->super_VertexArrayTest).m_glArrayPack;
    (*pCVar7->_vptr_ContextArrayPack[4])(pCVar7,(ulong)uVar5);
    pCVar7 = (this->super_VertexArrayTest).m_rrArrayPack;
    (*pCVar7->_vptr_ContextArrayPack[4])(pCVar7,(ulong)uVar5);
    pCVar7 = (this->super_VertexArrayTest).m_glArrayPack;
    iVar21 = (*pCVar7->_vptr_ContextArrayPack[2])(pCVar7,uVar27 & 0xffffffff);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar21) + 0x10))
              ((long *)CONCAT44(extraout_var_01,iVar21),1,iVar28,local_250,iVar22);
    pCVar7 = (this->super_VertexArrayTest).m_rrArrayPack;
    iVar21 = (*pCVar7->_vptr_ContextArrayPack[2])(pCVar7,uVar27 & 0xffffffff);
    (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar21) + 0x10))
              ((long *)CONCAT44(extraout_var_02,iVar21),1,iVar28,local_250,iVar22);
    pCVar7 = (this->super_VertexArrayTest).m_glArrayPack;
    iVar22 = (*pCVar7->_vptr_ContextArrayPack[2])(pCVar7,uVar27 & 0xffffffff);
    bVar25 = bVar16 & 1;
    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar22) + 0x20))
              ((long *)CONCAT44(extraout_var_03,iVar22),uVar27 & 0xffffffff,offset,componentCount,
               type,iVar4,bVar25,stride);
    pCVar7 = (this->super_VertexArrayTest).m_rrArrayPack;
    iVar22 = (*pCVar7->_vptr_ContextArrayPack[2])(pCVar7,uVar27 & 0xffffffff);
    (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar22) + 0x20))
              ((long *)CONCAT44(extraout_var_04,iVar22),uVar27 & 0xffffffff,offset,componentCount,
               type,iVar4,bVar25,stride);
    if (local_250 != (char *)0x0) {
      operator_delete__(local_250);
    }
    pAVar23 = (this->m_spec).arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar24 = (this->m_spec).arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar26 = lVar26 + 0x40;
  }
  pCVar7 = (this->super_VertexArrayTest).m_glArrayPack;
  (*pCVar7->_vptr_ContextArrayPack[5])
            (fVar30,local_264,pCVar7,(ulong)(this->m_spec).primitive,
             (ulong)(uint)(this->m_spec).first,(ulong)(uint)((this->m_spec).drawCount * iVar18),
             (ulong)((uVar17 & 0x300) == 0x100));
  pCVar7 = (this->super_VertexArrayTest).m_rrArrayPack;
  (*pCVar7->_vptr_ContextArrayPack[5])
            (fVar30,local_264,pCVar7,(ulong)(this->m_spec).primitive,
             (ulong)(uint)(this->m_spec).first,(ulong)(uint)(iVar18 * (this->m_spec).drawCount),
             (ulong)((uVar17 & 0x300) == 0x100));
  this->m_iteration = this->m_iteration + 1;
  return CONTINUE;
}

Assistant:

MultiVertexArrayTest::IterateResult MultiVertexArrayTest::iterate (void)
{
	if (m_iteration == 0)
	{
		const size_t	primitiveSize		= (m_spec.primitive == Array::PRIMITIVE_TRIANGLES) ? (6) : (1); // in non-indexed draw Triangles means rectangles
		float			coordScale			= 1.0f;
		float			colorScale			= 1.0f;
		const bool		useVao				= m_renderCtx.getType().getProfile() == glu::PROFILE_CORE;

		// Log info
		m_testCtx.getLog() << TestLog::Message << m_spec.getDesc() << TestLog::EndMessage;

		// Color and Coord scale
		{
			// First array is always position
			{
				Spec::ArraySpec arraySpec = m_spec.arrays[0];
				if (arraySpec.inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 1024.0;
				}
				else if (arraySpec.inputType == Array::INPUTTYPE_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 512.0;
				}
				else
					coordScale = (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(0.9 / double(arraySpec.max.toFloat())));

				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC3 || arraySpec.outputType == Array::OUTPUTTYPE_VEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_IVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_IVEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_UVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_UVEC4)
						coordScale = coordScale * 0.5f;
			}

			// And other arrays are color-like
			for (int arrayNdx = 1; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
			{
				Spec::ArraySpec arraySpec	= m_spec.arrays[arrayNdx];

				colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC4)
					colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
			}
		}

		// Data
		for (int arrayNdx = 0; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
		{
			Spec::ArraySpec arraySpec		= m_spec.arrays[arrayNdx];
			const int		seed			= int(arraySpec.inputType) + 10 * int(arraySpec.outputType) + 100 * int(arraySpec.storage) + 1000 * int(m_spec.primitive) + 10000 * int(arraySpec.usage) + int(m_spec.drawCount) + 12 * int(arraySpec.componentCount) + int(arraySpec.stride) + int(arraySpec.normalize);
			const char*		data			= DE_NULL;
			const size_t	stride			= (arraySpec.stride == 0) ? (arraySpec.componentCount * Array::inputTypeSize(arraySpec.inputType)) : (arraySpec.stride);
			const size_t	bufferSize		= arraySpec.offset + stride * (m_spec.drawCount * primitiveSize - 1) + arraySpec.componentCount  * Array::inputTypeSize(arraySpec.inputType);
			// Snap values to at least 3x3 grid
			const float		gridSize		= 3.0f / (float)(de::min(m_renderCtx.getRenderTarget().getWidth(), m_renderCtx.getRenderTarget().getHeight()) - 1);

			switch (m_spec.primitive)
			{
	//			case Array::PRIMITIVE_POINTS:
	//				data = RandomArrayGenerator::generateArray(seed, arraySpec.min, arraySpec.max, arraySpec.count, arraySpec.componentCount, arraySpec.stride, arraySpec.inputType);
	//				break;
				case Array::PRIMITIVE_TRIANGLES:
					if (arrayNdx == 0)
					{
						data = RandomArrayGenerator::generateQuads(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.offset, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max, gridSize);
					}
					else
					{
						DE_ASSERT(arraySpec.offset == 0); // \note [jarkko] it just hasn't been implemented
						data = RandomArrayGenerator::generatePerQuad(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max);
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}

			m_glArrayPack->newArray(arraySpec.storage);
			m_rrArrayPack->newArray(arraySpec.storage);

			m_glArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);
			m_rrArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);

			m_glArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);
			m_rrArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);

			delete [] data;
		}

		try
		{
			m_glArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
			m_rrArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;

			return STOP;
		}

		m_iteration++;
		return CONTINUE;
	}
	else if (m_iteration == 1)
	{
		compare();

		if (m_isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}

		m_iteration++;
		return STOP;
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}
}